

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.c
# Opt level: O2

uint crc_calc(uchar *data,int len)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = 0;
  if (len < 1) {
    len = 0;
  }
  uVar2 = 0;
  for (; len != (int)lVar1; lVar1 = lVar1 + 1) {
    uVar2 = uVar2 << 8 ^ crc_table[(uint)data[lVar1] ^ uVar2 >> 0x10 & 0xff];
  }
  return uVar2 & 0xffffff;
}

Assistant:

unsigned int
crc_calc(unsigned char *data, int len)
{
	unsigned int crc = 0;
	int i;

	for (i = 0; i < len; i++)
		crc = (crc << 8) ^ crc_table[(unsigned char)(crc >> 16) ^ *data++];

	/* ok */
	return (crc & 0xFFFFFF);
}